

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close.c
# Opt level: O3

int run_test_tcp_close(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_loop_t *loop;
  uv_tcp_t *req;
  uv_loop_t *unaff_RBX;
  int iVar3;
  uv_tcp_t *puVar4;
  uv_tcp_t *handle;
  sockaddr_in addr;
  uv_tcp_t tcp_server;
  uv_buf_t uStack_158;
  uv_loop_t *puStack_148;
  sockaddr_in local_120;
  sockaddr_in local_110;
  uv_tcp_t local_100;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_120);
  if (iVar1 == 0) {
    unaff_RBX = uv_default_loop();
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_110);
    if (iVar1 != 0) goto LAB_0016ef57;
    iVar1 = uv_tcp_init(unaff_RBX,&local_100);
    if (iVar1 != 0) goto LAB_0016ef5c;
    iVar1 = uv_tcp_bind(&local_100,(sockaddr *)&local_110,0);
    if (iVar1 != 0) goto LAB_0016ef61;
    iVar1 = uv_listen((uv_stream_t *)&local_100,0x80,connection_cb);
    if (iVar1 != 0) goto LAB_0016ef66;
    uv_unref((uv_handle_t *)&local_100);
    iVar1 = uv_tcp_init(unaff_RBX,&tcp_handle);
    if (iVar1 != 0) goto LAB_0016ef6b;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_handle,(sockaddr *)&local_120,connect_cb);
    if (iVar1 != 0) goto LAB_0016ef70;
    if (write_cb_called != 0) goto LAB_0016ef75;
    if (close_cb_called != 0) goto LAB_0016ef7a;
    iVar1 = uv_run(unaff_RBX,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016ef7f;
    printf("%d of %d write reqs seen\n",(ulong)(uint)write_cb_called,0x20);
    if (write_cb_called != 0x20) goto LAB_0016ef84;
    if (close_cb_called == 1) {
      unaff_RBX = uv_default_loop();
      uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
      uv_run(unaff_RBX,UV_RUN_DEFAULT);
      loop = uv_default_loop();
      iVar1 = uv_loop_close(loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016ef8e;
    }
  }
  else {
    run_test_tcp_close_cold_1();
LAB_0016ef57:
    run_test_tcp_close_cold_2();
LAB_0016ef5c:
    run_test_tcp_close_cold_3();
LAB_0016ef61:
    run_test_tcp_close_cold_4();
LAB_0016ef66:
    run_test_tcp_close_cold_5();
LAB_0016ef6b:
    run_test_tcp_close_cold_6();
LAB_0016ef70:
    run_test_tcp_close_cold_7();
LAB_0016ef75:
    run_test_tcp_close_cold_8();
LAB_0016ef7a:
    run_test_tcp_close_cold_9();
LAB_0016ef7f:
    run_test_tcp_close_cold_10();
LAB_0016ef84:
    run_test_tcp_close_cold_11();
  }
  run_test_tcp_close_cold_12();
LAB_0016ef8e:
  run_test_tcp_close_cold_13();
  puVar4 = (uv_tcp_t *)0x4;
  puStack_148 = unaff_RBX;
  uStack_158 = uv_buf_init("PING",4);
  iVar1 = 0x20;
  while( true ) {
    iVar3 = (int)puVar4;
    handle = (uv_tcp_t *)0xc0;
    req = (uv_tcp_t *)malloc(0xc0);
    if (req == (uv_tcp_t *)0x0) break;
    puVar4 = &tcp_handle;
    iVar2 = uv_write((uv_write_t *)req,(uv_stream_t *)&tcp_handle,&uStack_158,1,write_cb);
    iVar3 = (int)puVar4;
    handle = req;
    if (iVar2 != 0) goto LAB_0016f01d;
    iVar1 = iVar1 + -1;
    if (iVar1 == 0) {
      uv_close((uv_handle_t *)&tcp_handle,close_cb);
      return extraout_EAX;
    }
  }
  connect_cb_cold_2();
LAB_0016f01d:
  connect_cb_cold_1();
  if (iVar3 == 0) {
    return extraout_EAX_00;
  }
  connection_cb_cold_1();
  if (close_cb_called == 0) {
    if ((uv_tcp_t *)handle->next_closing == &tcp_handle) {
      write_cb_called = write_cb_called + 1;
      free(handle);
      return extraout_EAX_01;
    }
  }
  else {
    write_cb_cold_1();
  }
  write_cb_cold_2();
  if (handle == &tcp_handle) {
    close_cb_called = close_cb_called + 1;
    return 0x335ff8;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(tcp_close) {
  struct sockaddr_in addr;
  uv_tcp_t tcp_server;
  uv_loop_t* loop;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  loop = uv_default_loop();

  /* We can't use the echo server, it doesn't handle ECONNRESET. */
  start_server(loop, &tcp_server);

  r = uv_tcp_init(loop, &tcp_handle);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     &tcp_handle,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);

  ASSERT(write_cb_called == 0);
  ASSERT(close_cb_called == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  printf("%d of %d write reqs seen\n", write_cb_called, NUM_WRITE_REQS);

  ASSERT(write_cb_called == NUM_WRITE_REQS);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}